

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcLits.c
# Opt level: O1

int Mvc_CoverWorstLiteral(Mvc_Cover_t *pCover,Mvc_Cube_t *pMask)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Mvc_Cube_t *pMVar5;
  
  if (0 < pCover->nBits) {
    uVar2 = 0;
    uVar1 = 0xffffffff;
    uVar3 = 1000000;
    do {
      if ((pMask == (Mvc_Cube_t *)0x0) || ((pMask->pData[uVar2 >> 5] >> (uVar2 & 0x1f) & 1) != 0)) {
        pMVar5 = (pCover->lCubes).pHead;
        if (pMVar5 == (Mvc_Cube_t *)0x0) {
          uVar4 = 0;
        }
        else {
          uVar4 = 0;
          do {
            uVar4 = uVar4 + ((pMVar5->pData[uVar2 >> 5] >> (uVar2 & 0x1f) & 1) != 0);
            pMVar5 = pMVar5->pNext;
          } while (pMVar5 != (Mvc_Cube_t *)0x0);
        }
        if (1 < uVar4 && (int)uVar4 < (int)uVar3) {
          uVar3 = uVar4;
          uVar1 = uVar2;
        }
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != pCover->nBits);
    uVar2 = 0xffffffff;
    if ((int)uVar3 < 1000000) {
      uVar2 = uVar1;
    }
    return uVar2;
  }
  return -1;
}

Assistant:

int Mvc_CoverWorstLiteral( Mvc_Cover_t * pCover, Mvc_Cube_t * pMask )
{
    Mvc_Cube_t * pCube;
    int nWord, nBit;
    int i, iMin, nLitsMin, nLitsCur;
    int fUseFirst = 1;

    // go through each literal
    iMin = -1;
    nLitsMin = 1000000;
    for ( i = 0; i < pCover->nBits; i++ )
        if ( !pMask || Mvc_CubeBitValue(pMask,i) )
        {
            // get the word and bit of this literal
            nWord = Mvc_CubeWhichWord(i);
            nBit  = Mvc_CubeWhichBit(i);
            // go through all the cubes
            nLitsCur = 0;
            Mvc_CoverForEachCube( pCover, pCube )
                if ( pCube->pData[nWord] & (1<<nBit) )
                    nLitsCur++;

            // skip the literal that does not occur or occurs once
            if ( nLitsCur < 2 )
                continue;

            // check if this is the best literal
            if ( fUseFirst )
            {
                if ( nLitsMin > nLitsCur )
                {
                    nLitsMin = nLitsCur;
                    iMin = i;
                }
            }
            else
            {
                if ( nLitsMin >= nLitsCur )
                {
                    nLitsMin = nLitsCur;
                    iMin = i;
                }
            }
        }

    if ( nLitsMin < 1000000 )
        return iMin;
    return -1;
}